

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantValue.cpp
# Opt level: O0

optional<slang::ConstantRange>
slang::ConstantRange::getIndexedRange(int32_t l,int32_t r,bool littleEndian,bool indexedUp)

{
  bool bVar1;
  int *piVar2;
  byte in_CL;
  byte in_DL;
  undefined4 extraout_EDX;
  undefined4 extraout_EDX_00;
  undefined4 extraout_EDX_01;
  undefined4 extraout_EDX_02;
  undefined4 uVar3;
  int in_EDI;
  optional<slang::ConstantRange> oVar4;
  optional<int> lower;
  optional<int> upper;
  int32_t count;
  ConstantRange result;
  ConstantRange *in_stack_ffffffffffffffa8;
  int32_t a;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  ConstantRange local_20;
  byte local_16;
  byte local_15;
  int local_10;
  _Storage<slang::ConstantRange,_true> local_c;
  undefined1 local_4;
  
  local_15 = in_DL & 1;
  local_16 = in_CL & 1;
  local_10 = in_EDI;
  ConstantRange(&local_20);
  a = (int32_t)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  if ((local_16 & 1) == 0) {
    checkedSubS32(a,(int32_t)in_stack_ffffffffffffffa8);
    bVar1 = std::optional::operator_cast_to_bool((optional<int> *)0x28217e);
    if (!bVar1) {
      std::optional<slang::ConstantRange>::optional((optional<slang::ConstantRange> *)&local_c);
      uVar3 = extraout_EDX_00;
      goto LAB_002821dc;
    }
    local_20.left = local_10;
    piVar2 = std::optional<int>::operator*((optional<int> *)0x2821a0);
    local_20.right = *piVar2;
  }
  else {
    checkedAddS32(a,(int32_t)in_stack_ffffffffffffffa8);
    bVar1 = std::optional::operator_cast_to_bool((optional<int> *)0x282135);
    if (!bVar1) {
      std::optional<slang::ConstantRange>::optional((optional<slang::ConstantRange> *)&local_c);
      uVar3 = extraout_EDX;
      goto LAB_002821dc;
    }
    piVar2 = std::optional<int>::operator*((optional<int> *)0x282152);
    local_20.left = *piVar2;
    local_20.right = local_10;
  }
  if ((local_15 & 1) == 0) {
    reverse(in_stack_ffffffffffffffa8);
    std::optional<slang::ConstantRange>::optional<slang::ConstantRange,_true>
              ((optional<slang::ConstantRange> *)
               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffa8);
    uVar3 = extraout_EDX_01;
  }
  else {
    std::optional<slang::ConstantRange>::optional<slang::ConstantRange,_true>
              ((optional<slang::ConstantRange> *)
               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffa8);
    uVar3 = extraout_EDX_02;
  }
LAB_002821dc:
  oVar4.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ConstantRange>._9_3_ = (undefined3)((uint)uVar3 >> 8);
  oVar4.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ConstantRange>._M_engaged = (bool)local_4;
  oVar4.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ConstantRange>._M_payload = local_c;
  return (optional<slang::ConstantRange>)
         oVar4.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
         super__Optional_payload_base<slang::ConstantRange>;
}

Assistant:

std::optional<ConstantRange> ConstantRange::getIndexedRange(int32_t l, int32_t r, bool littleEndian,
                                                            bool indexedUp) {
    ConstantRange result;
    int32_t count = r - 1;
    if (indexedUp) {
        auto upper = checkedAddS32(l, count);
        if (!upper)
            return std::nullopt;

        result.left = *upper;
        result.right = l;
    }
    else {
        auto lower = checkedSubS32(l, count);
        if (!lower)
            return std::nullopt;

        result.left = l;
        result.right = *lower;
    }

    if (!littleEndian)
        return result.reverse();

    return result;
}